

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cpp
# Opt level: O1

void __thiscall ftxui::Dim::Render(Dim *this,Screen *screen)

{
  bool bVar1;
  Pixel *pPVar2;
  int x;
  int y;
  
  Node::Render((Node *)this,screen);
  y = (this->super_NodeDecorator).super_Node.box_.y_min;
  if (y <= (this->super_NodeDecorator).super_Node.box_.y_max) {
    do {
      x = (this->super_NodeDecorator).super_Node.box_.x_min;
      if (x <= (this->super_NodeDecorator).super_Node.box_.x_max) {
        do {
          pPVar2 = Screen::PixelAt(screen,x,y);
          pPVar2->field_0x28 = pPVar2->field_0x28 | 4;
          bVar1 = x < (this->super_NodeDecorator).super_Node.box_.x_max;
          x = x + 1;
        } while (bVar1);
      }
      bVar1 = y < (this->super_NodeDecorator).super_Node.box_.y_max;
      y = y + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    Node::Render(screen);
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).dim = true;
      }
    }
  }